

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_SetObjectData(JSContext *ctx,JSValue obj,JSValue val)

{
  ushort uVar1;
  int64_t iVar2;
  JSValueUnion JVar3;
  uint uVar4;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint uVar5;
  JSValueUnion JVar6;
  JSValueUnion JVar7;
  JSRefCountHeader *p_1;
  JSValue JVar8;
  
  JVar6 = val.u;
  JVar7 = obj.u;
  uVar5 = 0xffffffff;
  if ((int)obj.tag == -1) {
    uVar1 = *(ushort *)((long)JVar7.ptr + 6);
    uVar5 = (uint)uVar1;
    uVar4 = (uint)uVar1;
    if ((uVar1 - 4 < 4) || (uVar1 == 10)) {
      iVar2 = *(int64_t *)((long)JVar7.ptr + 0x38);
      if (0xfffffff4 < (uint)iVar2) {
        JVar3 = (JSValueUnion)((JSValueUnion *)((long)JVar7.ptr + 0x30))->ptr;
        uVar4 = *JVar3.ptr;
        *(uint *)JVar3.ptr = uVar4 - 1;
        if ((int)uVar4 < 2) {
          JVar8.tag = iVar2;
          JVar8.u.ptr = JVar3.ptr;
          __JS_FreeValueRT(ctx->rt,JVar8);
          uVar4 = extraout_EAX;
        }
      }
      ((JSValueUnion *)((long)JVar7.ptr + 0x30))->ptr = (void *)JVar6;
      *(int64_t *)((long)JVar7.ptr + 0x38) = val.tag;
      return uVar4;
    }
  }
  if (0xfffffff4 < (uint)val.tag) {
    uVar5 = *JVar6.ptr;
    *(uint *)JVar6.ptr = uVar5 - 1;
    if ((int)uVar5 < 2) {
      __JS_FreeValueRT(ctx->rt,val);
      uVar5 = extraout_EAX_00;
    }
  }
  if ((int)obj.tag == 6) {
    return uVar5;
  }
  JVar8 = JS_ThrowTypeError(ctx,"invalid object type");
  return JVar8.u._0_4_;
}

Assistant:

static int JS_SetObjectData(JSContext *ctx, JSValueConst obj, JSValue val)
{
    JSObject *p;

    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        p = JS_VALUE_GET_OBJ(obj);
        switch(p->class_id) {
        case JS_CLASS_NUMBER:
        case JS_CLASS_STRING:
        case JS_CLASS_BOOLEAN:
        case JS_CLASS_SYMBOL:
        case JS_CLASS_DATE:
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT:
        case JS_CLASS_BIG_FLOAT:
        case JS_CLASS_BIG_DECIMAL:
#endif
            JS_FreeValue(ctx, p->u.object_data);
            p->u.object_data = val;
            return 0;
        }
    }
    JS_FreeValue(ctx, val);
    if (!JS_IsException(obj))
        JS_ThrowTypeError(ctx, "invalid object type");
    return -1;
}